

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnCallIndirectExpr
          (BinaryReaderObjdumpDisassemble *this,uint32_t sig_index,uint32_t table_index)

{
  ulong uVar1;
  string_view sVar2;
  string_view sVar3;
  
  sVar2 = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,table_index);
  uVar1 = sVar2._M_len;
  sVar3 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->type_names,
                            sig_index);
  if (sVar3._M_len == 0) {
    if (uVar1 == 0) {
      LogOpcode(this,"%u (type %u)",(ulong)table_index,sig_index);
    }
    else {
      LogOpcode(this,"%u <%.*s> (type %u)",(ulong)table_index,uVar1 & 0xffffffff,sVar2._M_str,
                sig_index);
    }
  }
  else if (uVar1 == 0) {
    LogOpcode(this,"%u (type %u <%.*s>)",(ulong)table_index,sig_index,sVar3._M_len & 0xffffffff,
              sVar3._M_str);
  }
  else {
    LogOpcode(this,"%u <%.*s> (type %u <%.*s>)",(ulong)table_index,uVar1 & 0xffffffff,sVar2._M_str,
              sig_index,(undefined1  [16])sVar3);
  }
  this->skip_next_opcode_ = true;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnCallIndirectExpr(
    uint32_t sig_index,
    uint32_t table_index) {
  std::string_view table_name = GetTableName(table_index);
  std::string_view type_name = GetTypeName(sig_index);
  if (!type_name.empty() && !table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u <" PRIstringview ">)",
              table_index, WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else if (!table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u)", table_index,
              WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index);
  } else if (!type_name.empty()) {
    LogOpcode("%u (type %u <" PRIstringview ">)", table_index, sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else {
    LogOpcode("%u (type %u)", table_index, sig_index);
  }
  skip_next_opcode_ = true;
  return Result::Ok;
}